

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(char lhs,SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  undefined8 in_RAX;
  char ret;
  undefined8 uStack_18;
  
  uStack_18._7_1_ = (uchar)((ulong)in_RAX >> 0x38);
  uStack_18 = CONCAT35((int3)(((ulong)CONCAT11(uStack_18._7_1_,lhs) << 0x30) >> 0x28),
                       CONCAT14(rhs.m_int,(int)in_RAX));
  DivisionHelper<char,_unsigned_char,_4>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((char *)((long)&uStack_18 + 6),(uchar *)((long)&uStack_18 + 4),
             (char *)((long)&uStack_18 + 5));
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<char>
            ((SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             ((long)&uStack_18 + 7),(char *)((long)&uStack_18 + 5));
  return (SafeInt<unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         uStack_18._7_1_;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}